

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_flattener.h
# Opt level: O1

void __thiscall
mp::
ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::ConvertObj(ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
             *this,int i_obj)

{
  FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *this_00;
  long lVar1;
  LinkEntry be;
  int iVar2;
  undefined4 extraout_var;
  ValueNode *pVVar4;
  ulong uVar5;
  ExprBase e;
  size_ty request;
  ulong uVar6;
  Type *pTVar7;
  NodeIndexRange NVar8;
  long *plVar9;
  NodeRange NVar10;
  size_t index;
  AutoLinkScope<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  auto_link_scope;
  LinTerms le;
  EExpr qpnew;
  EExpr eexpr;
  LinearObjective lo;
  AutoLinkScope<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  local_578;
  type *local_570;
  type *local_568;
  ValueMap<mp::pre::ValueNode,_mp::pre::BasicValuePresolver_&> *local_560;
  ValueNode *local_558;
  NodeIndexRange NStack_550;
  ValueNode *local_548;
  NodeIndexRange NStack_540;
  ArrayRef<int> local_538;
  type local_510;
  ulong local_508;
  type local_500;
  undefined1 local_4f8 [48];
  int *local_4c8;
  ulong local_4c0;
  size_t local_4b8;
  int local_4b0 [6];
  undefined1 local_498 [120];
  small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U> local_420;
  type local_388;
  type local_378 [3];
  type local_340;
  type local_338;
  type local_330;
  undefined1 local_328 [24];
  small_vector_base<std::allocator<int>,_6U> local_310;
  ptr local_2e0;
  string local_2b0;
  LinTerms local_290;
  QuadTerms local_218;
  ptr local_d8;
  LinearObjective local_d0;
  long lVar3;
  
  iVar2 = (*(this->
            super_ExprConverter<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr>
            ).
            super_ExprVisitor<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr>
            .
            super_BasicExprVisitor<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr,_mp::internal::ExprTypes>
            ._vptr_BasicExprVisitor[0x12])();
  lVar3 = CONCAT44(extraout_var,iVar2);
  uVar6 = (ulong)i_obj;
  pVVar4 = pre::ValueMap<mp::pre::ValueNode,_mp::pre::BasicValuePresolver_&>::operator()
                     (&(this->flat_cvt_).
                       super_FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                       .value_presolver_.super_ValuePresolverImpl.src_.objs_);
  uVar5 = pVVar4->sz_;
  pVVar4->sz_ = uVar5 + 1;
  local_560 = &(this->flat_cvt_).
               super_FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
               .value_presolver_.super_ValuePresolverImpl.dest_.objs_;
  local_548 = pre::ValueMap<mp::pre::ValueNode,_mp::pre::BasicValuePresolver_&>::operator()
                        (local_560);
  NVar8 = (NodeIndexRange)((uVar5 & 0xffffffff | uVar5 << 0x20) + 0x100000000);
  uVar5 = local_548->sz_;
  NStack_540 = (NodeIndexRange)(uVar5 & 0xffffffff | (uVar5 << 0x20) + 0x100000000);
  local_548->sz_ = uVar5 + 1;
  be.first.ir_ = NVar8;
  be.first.pvn_ = pVVar4;
  be.second.pvn_ = local_548;
  be.second.ir_ = NStack_540;
  local_558 = pVVar4;
  NStack_550 = NVar8;
  pre::CopyLink::AddEntry
            (&(this->flat_cvt_).
              super_FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
              .copy_link_,be);
  this_00 = &this->flat_cvt_;
  (this->flat_cvt_).
  super_FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  .auto_link_src_item_.pvn_ = pVVar4;
  (this->flat_cvt_).
  super_FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  .auto_link_src_item_.ir_ = NVar8;
  lVar1 = *(long *)(lVar3 + 0x1f8);
  local_510 = (type)local_4f8;
  local_508 = 6;
  local_500 = (type)0x0;
  local_4c0 = 6;
  local_4c8 = local_4b0;
  local_4b8 = 0;
  request = (size_ty)*(int *)(lVar1 + 0x10 + uVar6 * 0x78);
  local_578.cvt_ = this_00;
  gch::detail::small_vector_base<std::allocator<double>,_6U>::request_capacity
            ((small_vector_base<std::allocator<double>,_6U> *)&local_510.__align,request);
  gch::detail::small_vector_base<std::allocator<int>,_6U>::request_capacity
            ((small_vector_base<std::allocator<int>,_6U> *)&local_4c8,request);
  plVar9 = (long *)(lVar1 + uVar6 * 0x78);
  for (pTVar7 = (Type *)*plVar9; pTVar7 != (Type *)(plVar9[2] * 0x10 + *plVar9); pTVar7 = pTVar7 + 4
      ) {
    local_290.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr = *(ptr *)(pTVar7 + 2);
    local_d0.sense_ = *pTVar7;
    gch::detail::small_vector_base<std::allocator<double>,6u>::append_element<double_const&>
              ((small_vector_base<std::allocator<double>,6u> *)&local_510.__align,
               (double *)&local_290);
    gch::detail::small_vector_base<std::allocator<int>,6u>::append_element<int_const&>
              ((small_vector_base<std::allocator<int>,6u> *)&local_4c8,(int *)&local_d0);
  }
  if (uVar6 < (ulong)(*(long *)(lVar3 + 0x218) - *(long *)(lVar3 + 0x210) >> 3)) {
    e.impl_ = *(Impl **)(*(long *)(lVar3 + 0x210) + uVar6 * 8);
  }
  else {
    e.impl_ = (Impl *)0x0;
  }
  local_290.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
  super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
       (ptr)&local_290.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.m_storage;
  local_290.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
  super_small_vector_data_base<double_*,_unsigned_long>.m_capacity = 6;
  local_290.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
  super_small_vector_data_base<double_*,_unsigned_long>.m_size = 0;
  local_290.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
  super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = 6;
  local_290.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
  super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
       (ptr)&local_290.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.m_storage;
  local_290.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
  super_small_vector_data_base<int_*,_unsigned_long>.m_size = 0;
  local_218.folded_.
  super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.m_data.
  super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.m_capacity =
       8;
  local_218.folded_.
  super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.m_data.
  super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.m_data_ptr =
       (ptr)&local_218.folded_.
             super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.
             m_data.m_storage;
  local_218.folded_.
  super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.m_data.
  super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.m_size = 0;
  local_218.coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
  super_small_vector_data_base<double_*,_unsigned_long>.m_capacity = 6;
  local_218.coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
  super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
       (ptr)&local_218.coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
             m_storage;
  local_218.coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
  super_small_vector_data_base<double_*,_unsigned_long>.m_size = 0;
  local_218.vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
  super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = 6;
  local_218.vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
  super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
       (ptr)&local_218.vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.m_storage;
  local_218.vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
  super_small_vector_data_base<int_*,_unsigned_long>.m_size = 0;
  local_218.vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
  super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = 6;
  local_218.vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
  super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
       (ptr)&local_218.vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.m_storage;
  local_218.vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
  super_small_vector_data_base<int_*,_unsigned_long>.m_size = 0;
  local_d8 = (ptr)0x0;
  if (e.impl_ != (Impl *)0x0) {
    BasicExprVisitor<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr,_mp::internal::ExprTypes>
    ::Visit((EExpr *)local_498,
            (BasicExprVisitor<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr,_mp::internal::ExprTypes>
             *)this,(Expr)e.impl_);
    gch::detail::small_vector_base<std::allocator<double>,_6U>::move_assign_default<6U,_nullptr>
              ((small_vector_base<std::allocator<double>,_6U> *)&local_290,
               (small_vector_base<std::allocator<double>,_6U> *)local_498);
    gch::detail::small_vector_base<std::allocator<int>,_6U>::move_assign_default<6U,_nullptr>
              (&local_290.vars_.super_small_vector_base<std::allocator<int>,_6U>,
               (small_vector_base<std::allocator<int>,_6U> *)(local_498 + 0x48));
    gch::detail::small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>::
    move_assign_default<8U,_nullptr>
              ((small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U> *)
               &local_218,&local_420);
    gch::detail::small_vector_base<std::allocator<double>,_6U>::move_assign_default<6U,_nullptr>
              (&local_218.coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>,
               (small_vector_base<std::allocator<double>,_6U> *)&local_388.__align);
    gch::detail::small_vector_base<std::allocator<int>,_6U>::move_assign_default<6U,_nullptr>
              (&local_218.vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>,
               (small_vector_base<std::allocator<int>,_6U> *)&local_340.__align);
    gch::detail::small_vector_base<std::allocator<int>,_6U>::move_assign_default<6U,_nullptr>
              (&local_218.vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>,&local_310);
    local_d8 = local_2e0;
    if (6 < local_310.m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
      operator_delete(local_310.m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr
                      ,local_310.m_data.super_small_vector_data_base<int_*,_unsigned_long>.
                       m_capacity << 2);
    }
    if (6 < (ulong)local_338) {
      operator_delete((void *)local_340,(long)local_338 << 2);
    }
    if (6 < (ulong)local_388._8_8_) {
      operator_delete((void *)local_388.__align,local_388._8_8_ << 3);
    }
    if ((pointer)0x8 <
        local_420.m_data.
        super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.
        m_capacity) {
      operator_delete(local_420.m_data.
                      super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                      .m_data_ptr,
                      local_420.m_data.
                      super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                      .m_capacity << 4);
    }
    if ((ptr)0x6 < (ulong)local_498._80_8_) {
      operator_delete((void *)local_498._72_8_,local_498._80_8_ << 2);
    }
    if ((pointer)0x6 < (ulong)local_498._8_8_) {
      operator_delete((void *)local_498._0_8_,local_498._8_8_ << 3);
    }
    LinTerms::add((LinTerms *)&local_510.__align,&local_290);
    if (((double)local_d8 != 0.0) || (NAN((double)local_d8))) {
      NVar10 = FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
               ::MakeFixedVar(&this_00->
                               super_FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                              ,(double)local_d8);
      local_d0.sense_ = MIN;
      local_d0.sense_true_ = 0x3ff00000;
      local_538.save_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)CONCAT44(local_538.save_.super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_start._4_4_,NVar10.ir_.beg_);
      gch::detail::small_vector_base<std::allocator<double>,6u>::append_element<double_const&>
                ((small_vector_base<std::allocator<double>,6u> *)&local_510.__align,
                 (double *)&local_d0);
      gch::detail::small_vector_base<std::allocator<int>,6u>::append_element<int_const&>
                ((small_vector_base<std::allocator<int>,6u> *)&local_4c8,(int *)&local_538);
    }
  }
  LinTerms::sort_terms((LinTerms *)&local_510.__align,true);
  QuadTerms::sort_terms(&local_218);
  if (((this->flat_cvt_).
       super_FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
       .options_.passQuadObj_ == 0) &&
     (local_218.folded_.
      super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.m_data.
      super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.m_size
      != 0)) {
    local_498._0_8_ = local_498 + 0x18;
    local_498._8_8_ = (pointer)0x6;
    local_498._16_8_ = (pointer)0x0;
    local_498._80_8_ = (ptr)0x6;
    local_498._72_8_ = (long)local_498 + 0x60;
    local_498._88_8_ = 0;
    local_420.m_data.
    super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.m_capacity
         = 8;
    local_420.m_data.
    super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.m_data_ptr
         = (ptr)&local_420.m_data.m_storage;
    local_420.m_data.
    super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.m_size = 0
    ;
    local_570 = &local_388;
    local_388._8_8_ = 6;
    local_388.__align = (anon_struct_8_0_00000001_for___align)((long)local_378[0].__data + 8);
    local_378[0].__align = (anon_struct_8_0_00000001_for___align)0x0;
    local_568 = &local_340;
    local_338 = (type)0x6;
    local_340 = (type)local_328;
    local_330 = (type)0x0;
    local_310.m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = 6;
    local_310.m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
         (ptr)&local_310.m_data.m_storage;
    local_310.m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_size = 0;
    local_2e0 = (ptr)0x0;
    gch::detail::small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>::
    move_assign_default<8U,_nullptr>
              (&local_420,
               (small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U> *)
               &local_218);
    gch::detail::small_vector_base<std::allocator<double>,_6U>::move_assign_default<6U,_nullptr>
              ((small_vector_base<std::allocator<double>,_6U> *)&local_570->__align,
               &local_218.coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>);
    gch::detail::small_vector_base<std::allocator<int>,_6U>::move_assign_default<6U,_nullptr>
              ((small_vector_base<std::allocator<int>,_6U> *)&local_568->__align,
               &local_218.vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>);
    gch::detail::small_vector_base<std::allocator<int>,_6U>::move_assign_default<6U,_nullptr>
              (&local_310,&local_218.vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>);
    iVar2 = FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
            ::Convert2Var(&this_00->
                           super_FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                          ,(QuadraticExpr *)local_498);
    local_218.folded_.
    super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.m_data.
    super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.m_size = 0
    ;
    local_218.coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_size = 0;
    local_218.vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_size = 0;
    local_218.vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_size = 0;
    local_d0.sense_ = MIN;
    local_d0.sense_true_ = 0x3ff00000;
    local_538.save_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)CONCAT44(local_538.save_.super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,iVar2);
    gch::detail::small_vector_base<std::allocator<double>,6u>::append_element<double_const&>
              ((small_vector_base<std::allocator<double>,6u> *)&local_510.__align,
               (double *)&local_d0);
    gch::detail::small_vector_base<std::allocator<int>,6u>::append_element<int_const&>
              ((small_vector_base<std::allocator<int>,6u> *)&local_4c8,(int *)&local_538);
    if (6 < local_310.m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
      operator_delete(local_310.m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr
                      ,local_310.m_data.super_small_vector_data_base<int_*,_unsigned_long>.
                       m_capacity << 2);
    }
    if (6 < (ulong)local_338) {
      operator_delete((void *)local_340,(long)local_338 << 2);
    }
    if (6 < (ulong)local_388._8_8_) {
      operator_delete((void *)local_388.__align,local_388._8_8_ << 3);
    }
    if ((pointer)0x8 <
        local_420.m_data.
        super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.
        m_capacity) {
      operator_delete(local_420.m_data.
                      super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                      .m_data_ptr,
                      local_420.m_data.
                      super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                      .m_capacity << 4);
    }
    if ((ptr)0x6 < (ulong)local_498._80_8_) {
      operator_delete((void *)local_498._72_8_,local_498._80_8_ << 2);
    }
    if ((pointer)0x6 < (ulong)local_498._8_8_) {
      operator_delete((void *)local_498._0_8_,local_498._8_8_ << 3);
    }
  }
  uVar5 = uVar6 + 0x3f;
  if (-1 < (long)uVar6) {
    uVar5 = uVar6;
  }
  local_498._0_8_ = (ptr)0x0;
  local_498._8_8_ = (pointer)0x0;
  local_498._16_8_ = (pointer)0x0;
  local_498._24_8_ = local_510;
  local_498._32_8_ = local_500;
  local_538.save_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_538.save_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_538.save_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_538.data_ = local_4c8;
  local_538.size_ = local_4b8;
  local_2b0._M_string_length = 0;
  local_2b0.field_2._M_local_buf[0] = '\0';
  local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
  LinearObjective::LinearObjective<mp::ArrayRef<double>,mp::ArrayRef<int>>
            (&local_d0,
             (uint)((*(ulong *)(((long)uVar5 >> 6) * 8 + *(long *)(lVar3 + 0x1d0) + -8 +
                               (ulong)((uVar6 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
                     (uVar6 & 0x3f) & 1) != 0),(ArrayRef<double> *)local_498,&local_538,&local_2b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
    operator_delete(local_2b0._M_dataplus._M_p,
                    CONCAT71(local_2b0.field_2._M_allocated_capacity._1_7_,
                             local_2b0.field_2._M_local_buf[0]) + 1);
  }
  if (local_538.save_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_538.save_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_538.save_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_538.save_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((ptr)local_498._0_8_ != (ptr)0x0) {
    operator_delete((void *)local_498._0_8_,local_498._16_8_ - local_498._0_8_);
  }
  QuadraticObjective::QuadraticObjective((QuadraticObjective *)local_498,&local_d0,&local_218);
  FlatModel<mp::DefaultFlatModelParams>::AddObjective
            ((FlatModel<mp::DefaultFlatModelParams> *)this_00,(QuadraticObjective *)local_498);
  pre::ValueMap<mp::pre::ValueNode,_mp::pre::BasicValuePresolver_&>::operator()(local_560);
  QuadraticObjective::~QuadraticObjective((QuadraticObjective *)local_498);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.name_._M_dataplus._M_p != &local_d0.name_.field_2) {
    operator_delete(local_d0.name_._M_dataplus._M_p,local_d0.name_.field_2._M_allocated_capacity + 1
                   );
  }
  if (6 < local_d0.lt_.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
          super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
    operator_delete(local_d0.lt_.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                    local_d0.lt_.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
  }
  if (6 < local_d0.lt_.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
          super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
    operator_delete(local_d0.lt_.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                    local_d0.lt_.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
  }
  if (6 < local_218.vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
          super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
    operator_delete(local_218.vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                    local_218.vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
  }
  if (6 < local_218.vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
          super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
    operator_delete(local_218.vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                    local_218.vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
  }
  if (6 < local_218.coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
          super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
    operator_delete(local_218.coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                    local_218.coefs_aux_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
  }
  if (8 < local_218.folded_.
          super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.
          m_data.
          super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.
          m_capacity) {
    operator_delete(local_218.folded_.
                    super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                    .m_data.
                    super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                    .m_data_ptr,
                    local_218.folded_.
                    super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                    .m_data.
                    super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                    .m_capacity << 4);
  }
  if (6 < local_290.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
          super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
    operator_delete(local_290.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                    local_290.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
  }
  if (6 < local_290.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
          super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
    operator_delete(local_290.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                    local_290.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
  }
  if (6 < local_4c0) {
    operator_delete(local_4c8,local_4c0 << 2);
  }
  if (6 < local_508) {
    operator_delete((void *)local_510,local_508 << 3);
  }
  pre::
  AutoLinkScope<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  ::~AutoLinkScope(&local_578);
  return;
}

Assistant:

void ConvertObj(int i_obj) {
    try {
      typename ProblemType::MutObjective obj = GetModel().obj(i_obj);
      auto obj_src =              // source value node for this obj
          GetValuePresolver().GetSourceNodes().GetObjValues()().Add();
      GetCopyLink().AddEntry(
          {
           obj_src,
           GetValuePresolver().GetTargetNodes().GetObjValues()().Add() });
      /// After the CopyLink, add One2ManyLink for converted expressions.
      /// When postsolving, CopyLink is executed last and copies obj values.
      /// This should resolve the issue of the "max-out"
      /// value conflict resolution.
      /// Tested by suf_common/funcpieces_01_01_obj.mod.
      pre::AutoLinkScope<FlatConverterType> auto_link_scope{
          GetFlatCvt(), obj_src
      };
      auto le = ToLinTerms(obj.linear_expr());
      NumericExpr e = obj.nonlinear_expr();
      EExpr eexpr;
      if (e) {
        eexpr=MP_DISPATCH( Visit(e) );
        le.add(eexpr.GetLinTerms());
        if (std::fabs(eexpr.constant_term())!=0.0) {
          /// Not using objective constant, should we?
          le.add_term(1.0, MakeFixedVar(eexpr.constant_term()));
        }
      }
      /// Sort/merge terms, otherwise we lose repeated terms
      /// in Gurobi where we just set 'obj attributes'
      /// to variables.
      /// Context is propagated after adding all objectives.
      le.sort_terms();
      eexpr.GetQPTerms().sort_terms();
      if (!GetFlatCvt().IfPassQuadObj()            // SCIP 10
          && eexpr.GetQPTerms().size()) {
        EExpr qpnew;
        qpnew.GetQPTerms() = std::move(eexpr.GetQPTerms());
        int qpres = Convert2Var(std::move(qpnew));
        eexpr.GetQPTerms().clear();                // explicitly remove obj qp terms
        le.add_term(1.0, qpres);
      }
      /// Add linear / quadratic obj
      LinearObjective lo { obj.type(),
                         std::move(le.coefs()), std::move(le.vars()) };
      GetFlatCvt().AddObjective(
          QuadraticObjective{std::move(lo),
                             std::move(eexpr.GetQPTerms())});
    } catch (const std::exception& exc) {
      MP_RAISE(fmt::format(
          "Error flattening objective _obj[{}]:\n  {}", i_obj, exc.what()));
    }
  }